

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorMultiViewportTests.cpp
# Opt level: O3

TestStatus *
vkt::FragmentOperations::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,int numViewports)

{
  VkBool32 *this;
  TestLog *log;
  VkImageSubresourceRange subresourceRange;
  TextureFormat TVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  void *pvVar5;
  undefined8 obj;
  Handle<(vk::HandleType)18> HVar6;
  undefined1 auVar7 [8];
  undefined1 auVar8 [8];
  TextureFormat TVar9;
  TextureFormat TVar10;
  TextureFormat TVar11;
  deUint32 queueFamilyIndex;
  VkResult result;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  DeviceInterface *vk_00;
  VkDevice device;
  Allocator *pAVar12;
  TextureFormat TVar13;
  DeviceInterface *pDVar14;
  VkDevice pVVar15;
  const_iterator cVar16;
  VkQueue queue;
  NotSupportedError *this_00;
  ChannelOrder CVar17;
  float fVar18;
  VkDeviceSize bufferSize;
  int iVar19;
  ulong uVar20;
  ChannelType CVar21;
  pointer pVVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  undefined4 uVar27;
  ConstPixelBufferAccess resultImage;
  TextureLevel referenceImage;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> scissors;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> rectScissors;
  ChannelOrder local_798;
  ChannelType CStack_794;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexColors;
  VkPhysicalDeviceFeatures features;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> local_5d0;
  Move<vk::Handle<(vk::HandleType)18>_> local_5b8;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> viewports;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_510;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  deUint32 local_4e8;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  VkPhysicalDeviceType local_4c8;
  deUint32 dStack_4c4;
  deUint32 dStack_4c0;
  deUint32 dStack_4bc;
  TextureFormat local_4b8;
  float afStack_4b0 [2];
  deUint32 *local_4a8;
  VkDeviceSize VStack_4a0;
  TextureFormat local_498;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_490;
  long *local_478;
  Handle<(vk::HandleType)9> HStack_470;
  TextureFormat local_468;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_460;
  TextureFormat local_448;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_440;
  VkAllocationCallbacks *local_428;
  Handle<(vk::HandleType)8> HStack_420;
  TextureFormat local_418;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_410;
  TextureFormat local_3f8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_3f0;
  TextureFormat local_3d8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_3d0;
  VkRenderPass local_3b8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_3b0;
  TextureFormat local_398;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_390;
  TextureFormat local_378;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_370;
  VkPipeline local_358;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_350;
  TextureFormat local_338;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_330;
  TextureFormat local_318;
  long *plStack_310;
  VkBool32 local_308;
  VkBool32 VStack_304;
  VkBool32 VStack_300;
  VkBool32 VStack_2fc;
  uint local_29c;
  TextureFormat local_198;
  int aiStack_190 [4];
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkAttachmentReference colorAttachmentRef;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [1];
  VkViewport res_1;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceFeatures(&features,vk,physicalDevice);
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_4d8,vk,physicalDevice);
  if (features.geometryShader == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Required feature is not supported: geometryShader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
               ,0x179);
  }
  else if (features.multiViewport == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Required feature is not supported: multiViewport",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
               ,0x17c);
  }
  else {
    if (0xf < local_29c) {
      vk_00 = Context::getDeviceInterface(context);
      device = Context::getDevice(context);
      pAVar12 = Context::getDefaultAllocator(context);
      local_198.order = 0x3f000000;
      local_198.type = 0x3f000000;
      aiStack_190[0] = 0x3f000000;
      aiStack_190[1] = 0x3f800000;
      local_4d8._0_4_ = 0x3e3851ec;
      local_4d8._4_4_ = 0x3ed70a3d;
      fStack_4d0 = 0.17;
      fStack_4cc = 1.0;
      local_4c8 = 0x3e947ae1;
      dStack_4c4 = 0x3f1eb852;
      dStack_4c0 = 0x3e8f5c29;
      dStack_4bc = 0x3f800000;
      local_4b8 = (TextureFormat)0x3f570a3d3f170a3d;
      afStack_4b0[0] = 0.44;
      afStack_4b0[1] = 1.0;
      local_4a8 = (deUint32 *)0x3f7333333f75c28f;
      VStack_4a0._0_4_ = 0.72;
      VStack_4a0._4_4_ = 1.0;
      local_498 = (TextureFormat)0x3f0ccccd3f70a3d7;
      DStack_490.m_deviceIface = (DeviceInterface *)0x3f8000003ec7ae14;
      DStack_490.m_device = (VkDevice)0x3e428f5c3f51eb85;
      DStack_490.m_allocator = (VkAllocationCallbacks *)0x3f8000003df5c28f;
      local_478 = (long *)0x3e19999a3eeb851f;
      HStack_470.m_internal = 0x3f8000003e851eb8;
      local_468.order = 0x3e75c28f;
      local_468.type = 0x3e0f5c29;
      DStack_460.m_deviceIface = (DeviceInterface *)0x3f8000003e75c28f;
      DStack_460.m_device = (VkDevice)0x3e9eb8523efae148;
      DStack_460.m_allocator = (VkAllocationCallbacks *)0x3f8000003e851eb8;
      local_448.order = 0x3f47ae14;
      local_448.type = 0x3f051eb8;
      DStack_440.m_deviceIface = (DeviceInterface *)0x3f8000003ea8f5c3;
      DStack_440.m_device = (VkDevice)0x3f51eb853f70a3d7;
      DStack_440.m_allocator = (VkAllocationCallbacks *)0x3f8000003e9eb852;
      local_428 = (VkAllocationCallbacks *)0x3f2666663f7ae148;
      HStack_420.m_internal = 0x3f8000003e99999a;
      local_418.order = 0x3e6147ae;
      local_418.type = 0x3f266666;
      DStack_410.m_deviceIface = (DeviceInterface *)0x3f8000003f07ae14;
      DStack_410.m_device = (VkDevice)0x3f4f5c293f2b851f;
      DStack_410.m_allocator = (VkAllocationCallbacks *)0x3f8000003f68f5c3;
      local_3f8.order = 0x3edc28f6;
      local_3f8.type = 0x3ee147ae;
      DStack_3f0.m_deviceIface = (DeviceInterface *)0x3f8000003f400000;
      DStack_3f0.m_device = (VkDevice)0x3e75c28f3e851eb8;
      DStack_3f0.m_allocator = (VkAllocationCallbacks *)0x3f8000003ef5c28f;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      vector<tcu::Vector<float,4>const*,void>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertexColors,
                 (Vector<float,_4> *)local_4d8,
                 (Vector<float,_4> *)(local_4d8 + (long)numViewports * 0x10),
                 (allocator_type *)&features);
      fVar25 = (float)numViewports;
      if (fVar25 < 0.0) {
        fVar26 = sqrtf(fVar25);
      }
      else {
        fVar26 = SQRT(fVar25);
      }
      fVar26 = ceilf(fVar26);
      fVar25 = ceilf(fVar25 / (float)(int)fVar26);
      scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::reserve
                (&scissors,(long)numViewports);
      if (0 < numViewports) {
        iVar19 = 0;
        CVar21 = SNORM_INT8;
        CVar17 = R;
        do {
          fStack_4cc = (float)(0x80 / (long)(int)fVar25);
          if (iVar19 != 0) {
            bVar24 = iVar19 % (int)fVar26 == 0;
            if (bVar24) {
              CVar17 = R;
            }
            fVar18 = 0.0;
            if (bVar24) {
              fVar18 = fStack_4cc;
            }
            CVar21 = CVar21 + (int)fVar18;
          }
          local_4d8._4_4_ = CVar21;
          local_4d8._0_4_ = CVar17;
          fVar18 = (float)(0x80 / (long)(int)fVar26);
          fStack_4d0 = fVar18;
          std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
          emplace_back<tcu::Vector<int,4>>
                    ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)&scissors,
                     (Vector<int,_4> *)local_4d8);
          CVar17 = CVar17 + (int)fVar18;
          iVar19 = iVar19 + 1;
        } while (numViewports != iVar19);
      }
      TVar13 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
      iVar19 = tcu::getPixelSize(TVar13);
      bufferSize = (VkDeviceSize)(iVar19 << 0xe);
      makeBufferCreateInfo((VkBufferCreateInfo *)local_4d8,bufferSize,2);
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&features,vk_00,device,
                         (VkBufferCreateInfo *)local_4d8,(VkAllocationCallbacks *)0x0);
      obj = features._0_8_;
      DStack_510.m_device = (VkDevice)features._16_8_;
      DStack_510.m_deviceIface = (DeviceInterface *)features._8_8_;
      bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4d8,vk_00,
                 device,pAVar12,(VkBuffer)features._0_8_,(MemoryRequirement)0x1);
      auVar7 = local_4d8;
      memset(*(void **)((long)local_4d8 + 0x18),0,bufferSize);
      ::vk::flushMappedMemoryRange
                (vk_00,device,(VkDeviceMemory)((VkDeviceMemory *)((long)auVar7 + 8))->m_internal,
                 *(VkDeviceSize *)((long)auVar7 + 0x10),bufferSize);
      features._0_8_ = context->m_testCtx->m_log;
      this = &features.imageCubeArray;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"Rendering a colorful grid of ",0x1d);
      std::ostream::operator<<(this,numViewports);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," rectangle(s).",0xe);
      local_4d8 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&features,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_4d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_4d0,"Not covered area will be filled with a gray color.",0x32);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_4d0);
      std::ios_base::~ios_base((ios_base *)&DStack_460);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
      std::ios_base::~ios_base((ios_base *)&features.shaderStorageImageMultisample);
      local_4d8._0_4_ = 0x80;
      local_4d8._4_4_ = 0x80;
      fStack_4d0 = 5.1848e-44;
      fStack_4cc = 1.4013e-45;
      local_4c8 = VK_PHYSICAL_DEVICE_TYPE_OTHER;
      dStack_4c4 = 1;
      dStack_4c0 = 0;
      dStack_4bc = 1;
      local_4b8 = local_198;
      afStack_4b0[0] = (float)aiStack_190[0];
      afStack_4b0[1] = (float)aiStack_190[1];
      VStack_4a0 = (long)vertexColors.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)vertexColors.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      local_4a8 = (deUint32 *)CONCAT44(local_4a8._4_4_,numViewports);
      local_498 = (TextureFormat)0x0;
      DStack_490.m_deviceIface = (DeviceInterface *)0x0;
      DStack_490.m_device = (VkDevice)0x0;
      DStack_490.m_allocator = (VkAllocationCallbacks *)0x0;
      local_478 = (long *)0x0;
      local_468.order = R;
      local_468.type = SNORM_INT8;
      DStack_460.m_deviceIface = (DeviceInterface *)0x0;
      DStack_460.m_device = (VkDevice)0x0;
      DStack_460.m_allocator = (VkAllocationCallbacks *)0x0;
      local_448.order = R;
      local_448.type = SNORM_INT8;
      DStack_440.m_deviceIface = (DeviceInterface *)0x0;
      DStack_440.m_device = (VkDevice)0x0;
      DStack_440.m_allocator = (VkAllocationCallbacks *)0x0;
      local_428 = (VkAllocationCallbacks *)0x0;
      memset(&local_418,0,0x120);
      pDVar14 = Context::getDeviceInterface(context);
      pVVar15 = Context::getDevice(context);
      queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
      pAVar12 = Context::getDefaultAllocator(context);
      features.robustBufferAccess = 0xe;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 0;
      features.tessellationShader = 1;
      features.sampleRateShading = (VkBool32)fStack_4d0;
      features.dualSrcBlend = local_4d8._0_4_;
      features.logicOp = local_4d8._4_4_;
      features.multiDrawIndirect = 1;
      features.drawIndirectFirstInstance = 1;
      features.depthClamp = 1;
      features.depthBiasClamp = 1;
      features.fillModeNonSolid = 0;
      features.depthBounds = 0x11;
      features.wideLines = 0;
      features.largePoints = 0;
      features.multiViewport = 0;
      features.samplerAnisotropy = 0;
      features._80_8_ = (ulong)features.textureCompressionASTC_LDR << 0x20;
      ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&referenceImage,pDVar14,pVVar15,
                        (VkImageCreateInfo *)&features,(VkAllocationCallbacks *)0x0);
      pvVar5 = referenceImage.m_data.m_ptr;
      uVar3 = referenceImage._16_8_;
      uVar2 = referenceImage.m_size.m_data._0_8_;
      TVar13 = referenceImage.m_format;
      resultImage.m_size.m_data[2] = referenceImage.m_size.m_data[2];
      resultImage.m_pitch.m_data[0] = referenceImage._20_4_;
      resultImage.m_pitch.m_data._4_8_ = referenceImage.m_data.m_ptr;
      resultImage.m_format = referenceImage.m_format;
      resultImage.m_size.m_data[0] = referenceImage.m_size.m_data[0];
      resultImage.m_size.m_data[1] = referenceImage.m_size.m_data[1];
      referenceImage.m_format.order = R;
      referenceImage.m_format.type = SNORM_INT8;
      referenceImage.m_size.m_data[0] = 0;
      referenceImage.m_size.m_data[1] = 0;
      referenceImage.m_size.m_data[2] = 0;
      referenceImage._20_4_ = 0;
      referenceImage.m_data.m_ptr = (void *)0x0;
      if (local_498 == (TextureFormat)0x0) {
        DStack_490.m_device = (VkDevice)uVar3;
        DStack_490.m_allocator = (VkAllocationCallbacks *)pvVar5;
        local_498 = TVar13;
        DStack_490.m_deviceIface = (DeviceInterface *)uVar2;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  (&DStack_490,(VkImage)local_498);
        DStack_490.m_device = (VkDevice)resultImage._16_8_;
        DStack_490.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
        local_498 = resultImage.m_format;
        DStack_490.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
        if (referenceImage.m_format != (TextureFormat)0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&referenceImage.m_size,
                     (VkImage)referenceImage.m_format);
        }
      }
      bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&features,pDVar14,
                pVVar15,pAVar12,(VkImage)local_498,(MemoryRequirement)0x0);
      uVar2 = features._0_8_;
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      if (local_478 != (long *)uVar2) {
        if (local_478 == (long *)0x0) {
          local_478 = (long *)uVar2;
        }
        else {
          (**(code **)(*local_478 + 8))();
          local_478 = (long *)uVar2;
          if (features._0_8_ != 0) {
            (**(code **)(*(long *)features._0_8_ + 8))();
          }
        }
      }
      local_4f8 = CONCAT44(local_4c8,fStack_4cc);
      uStack_4f0 = CONCAT44(dStack_4c0,dStack_4c4);
      local_4e8 = dStack_4bc;
      subresourceRange.baseMipLevel = local_4c8;
      subresourceRange.aspectMask = (VkImageAspectFlags)fStack_4cc;
      subresourceRange.levelCount = dStack_4c4;
      subresourceRange.baseArrayLayer = dStack_4c0;
      subresourceRange.layerCount = dStack_4bc;
      makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&resultImage,pDVar14,pVVar15,
                    (VkImage)local_498,VK_IMAGE_VIEW_TYPE_2D,(VkFormat)fStack_4d0,subresourceRange);
      uVar4 = resultImage.m_pitch.m_data._4_8_;
      uVar3 = resultImage._16_8_;
      uVar2 = resultImage.m_size.m_data._0_8_;
      TVar13 = resultImage.m_format;
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      if (local_468 == (TextureFormat)0x0) {
        DStack_460.m_device = (VkDevice)uVar3;
        DStack_460.m_allocator = (VkAllocationCallbacks *)uVar4;
        local_468 = TVar13;
        DStack_460.m_deviceIface = (DeviceInterface *)uVar2;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  (&DStack_460,(VkImageView)local_468);
        DStack_460.m_allocator =
             (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
        DStack_460.m_device = (VkDevice)features._16_8_;
        local_468.order = features.robustBufferAccess;
        local_468.type = features.fullDrawIndexUint32;
        DStack_460.m_deviceIface = (DeviceInterface *)features._8_8_;
        if (resultImage.m_format != (TextureFormat)0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&resultImage.m_size,
                     (VkImageView)resultImage.m_format);
        }
      }
      makeBufferCreateInfo((VkBufferCreateInfo *)&features,VStack_4a0,0x80);
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&referenceImage,pDVar14,pVVar15,
                         (VkBufferCreateInfo *)&features,(VkAllocationCallbacks *)0x0);
      pvVar5 = referenceImage.m_data.m_ptr;
      uVar3 = referenceImage._16_8_;
      uVar2 = referenceImage.m_size.m_data._0_8_;
      TVar13 = referenceImage.m_format;
      resultImage.m_size.m_data[2] = referenceImage.m_size.m_data[2];
      resultImage.m_pitch.m_data[0] = referenceImage._20_4_;
      resultImage.m_pitch.m_data._4_8_ = referenceImage.m_data.m_ptr;
      resultImage.m_format = referenceImage.m_format;
      resultImage.m_size.m_data[0] = referenceImage.m_size.m_data[0];
      resultImage.m_size.m_data[1] = referenceImage.m_size.m_data[1];
      referenceImage.m_format.order = R;
      referenceImage.m_format.type = SNORM_INT8;
      referenceImage.m_size.m_data[0] = 0;
      referenceImage.m_size.m_data[1] = 0;
      referenceImage.m_size.m_data[2] = 0;
      referenceImage._20_4_ = 0;
      referenceImage.m_data.m_ptr = (void *)0x0;
      if (local_448 == (TextureFormat)0x0) {
        DStack_440.m_device = (VkDevice)uVar3;
        DStack_440.m_allocator = (VkAllocationCallbacks *)pvVar5;
        local_448 = TVar13;
        DStack_440.m_deviceIface = (DeviceInterface *)uVar2;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&DStack_440,(VkBuffer)local_448);
        DStack_440.m_device = (VkDevice)resultImage._16_8_;
        DStack_440.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
        local_448 = resultImage.m_format;
        DStack_440.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
        if (referenceImage.m_format != (TextureFormat)0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&referenceImage.m_size,
                     (VkBuffer)referenceImage.m_format);
        }
      }
      bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&features,pDVar14,
                 pVVar15,pAVar12,(VkBuffer)local_448,(MemoryRequirement)0x1);
      uVar2 = features._0_8_;
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      if (local_428 != (VkAllocationCallbacks *)uVar2) {
        if (local_428 == (VkAllocationCallbacks *)0x0) {
          local_428 = (VkAllocationCallbacks *)uVar2;
        }
        else {
          (**(code **)((long)local_428->pUserData + 8))();
          local_428 = (VkAllocationCallbacks *)uVar2;
          if (features._0_8_ != 0) {
            (**(code **)(*(long *)features._0_8_ + 8))();
          }
        }
      }
      memcpy(local_428->pfnFree,
             vertexColors.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,VStack_4a0);
      ::vk::flushMappedMemoryRange
                (pDVar14,pVVar15,(VkDeviceMemory)local_428->pfnAllocation,
                 (VkDeviceSize)local_428->pfnReallocation,VStack_4a0);
      TVar13 = (TextureFormat)(referenceImage.m_size.m_data + 2);
      referenceImage.m_size.m_data[0] = 4;
      referenceImage.m_size.m_data[1] = 0;
      referenceImage._16_5_ = 0x74726576;
      referenceImage.m_format = TVar13;
      cVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       *)context->m_progCollection,(key_type *)&referenceImage);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,pDVar14,pVVar15,
                 *(ProgramBinary **)(cVar16._M_node + 2),0);
      uVar4 = resultImage.m_pitch.m_data._4_8_;
      uVar3 = resultImage._16_8_;
      uVar2 = resultImage.m_size.m_data._0_8_;
      TVar1 = resultImage.m_format;
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      if (local_418 == (TextureFormat)0x0) {
        DStack_410.m_device = (VkDevice)uVar3;
        DStack_410.m_allocator = (VkAllocationCallbacks *)uVar4;
        local_418 = TVar1;
        DStack_410.m_deviceIface = (DeviceInterface *)uVar2;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&DStack_410,(VkShaderModule)local_418);
        DStack_410.m_allocator =
             (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
        DStack_410.m_device = (VkDevice)features._16_8_;
        local_418.order = features.robustBufferAccess;
        local_418.type = features.fullDrawIndexUint32;
        DStack_410.m_deviceIface = (DeviceInterface *)features._8_8_;
        if (resultImage.m_format != (TextureFormat)0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&resultImage.m_size,
                     (VkShaderModule)resultImage.m_format);
        }
      }
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      if (referenceImage.m_format != TVar13) {
        operator_delete((void *)referenceImage.m_format,referenceImage._16_8_ + 1);
      }
      referenceImage.m_size.m_data[0] = 4;
      referenceImage.m_size.m_data[1] = 0;
      referenceImage._16_5_ = 0x6d6f6567;
      referenceImage.m_format = TVar13;
      cVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       *)context->m_progCollection,(key_type *)&referenceImage);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,pDVar14,pVVar15,
                 *(ProgramBinary **)(cVar16._M_node + 2),0);
      uVar4 = resultImage.m_pitch.m_data._4_8_;
      uVar3 = resultImage._16_8_;
      uVar2 = resultImage.m_size.m_data._0_8_;
      TVar1 = resultImage.m_format;
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      if (local_3f8 == (TextureFormat)0x0) {
        DStack_3f0.m_device = (VkDevice)uVar3;
        DStack_3f0.m_allocator = (VkAllocationCallbacks *)uVar4;
        local_3f8 = TVar1;
        DStack_3f0.m_deviceIface = (DeviceInterface *)uVar2;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&DStack_3f0,(VkShaderModule)local_3f8);
        DStack_3f0.m_allocator =
             (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
        DStack_3f0.m_device = (VkDevice)features._16_8_;
        local_3f8.order = features.robustBufferAccess;
        local_3f8.type = features.fullDrawIndexUint32;
        DStack_3f0.m_deviceIface = (DeviceInterface *)features._8_8_;
        if (resultImage.m_format != (TextureFormat)0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&resultImage.m_size,
                     (VkShaderModule)resultImage.m_format);
        }
      }
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      if (referenceImage.m_format != TVar13) {
        operator_delete((void *)referenceImage.m_format,referenceImage._16_8_ + 1);
      }
      referenceImage.m_size.m_data[0] = 4;
      referenceImage.m_size.m_data[1] = 0;
      referenceImage._16_5_ = 0x67617266;
      referenceImage.m_format = TVar13;
      cVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       *)context->m_progCollection,(key_type *)&referenceImage);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,pDVar14,pVVar15,
                 *(ProgramBinary **)(cVar16._M_node + 2),0);
      DStack_3d0.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
      DStack_3d0.m_device = (VkDevice)resultImage._16_8_;
      DStack_3d0.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
      TVar1 = resultImage.m_format;
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      if (local_3d8 == (TextureFormat)0x0) {
        local_3d8 = TVar1;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&DStack_3d0,(VkShaderModule)local_3d8);
        DStack_3d0.m_allocator =
             (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
        DStack_3d0.m_device = (VkDevice)features._16_8_;
        local_3d8.order = features.robustBufferAccess;
        local_3d8.type = features.fullDrawIndexUint32;
        DStack_3d0.m_deviceIface = (DeviceInterface *)features._8_8_;
        if (resultImage.m_format != (TextureFormat)0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&resultImage.m_size,
                     (VkShaderModule)resultImage.m_format);
        }
      }
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      if (referenceImage.m_format != TVar13) {
        operator_delete((void *)referenceImage.m_format,referenceImage._16_8_ + 1);
      }
      referenceImage.m_format = (TextureFormat)((ulong)(uint)fStack_4d0 << 0x20);
      referenceImage.m_size.m_data[0] = 1;
      referenceImage.m_size.m_data[1] = 1;
      referenceImage.m_size.m_data[2] = 0;
      referenceImage._20_4_ = 2;
      referenceImage.m_data.m_ptr = &DAT_00000001;
      referenceImage.m_data.m_cap = CONCAT44(referenceImage.m_data.m_cap._4_4_,2);
      features._32_8_ = &colorAttachmentRef;
      colorAttachmentRef.attachment = 0;
      colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      features.geometryShader = 0;
      features.tessellationShader = 0;
      features.dualSrcBlend = 0;
      features.drawIndirectFirstInstance = 0;
      features.depthClamp = 0;
      features.largePoints = 0;
      features.alphaToOne = 0;
      features.depthBiasClamp = 0;
      features.fillModeNonSolid = 0;
      features.depthBounds = 0;
      features.wideLines = 0;
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.sampleRateShading = 1;
      resultImage.m_format.order = 0x26;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 1;
      resultImage.m_data = (void *)CONCAT44(resultImage.m_data._4_4_,1);
      resultImage.m_pitch.m_data._4_8_ = &referenceImage;
      ::vk::createRenderPass
                ((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineRasterizationStateInfo,pDVar14,
                 pVVar15,(VkRenderPassCreateInfo *)&resultImage,(VkAllocationCallbacks *)0x0);
      DStack_3b0.m_allocator = (VkAllocationCallbacks *)pipelineRasterizationStateInfo._24_8_;
      DStack_3b0.m_device = (VkDevice)pipelineRasterizationStateInfo._16_8_;
      DStack_3b0.m_deviceIface = (DeviceInterface *)pipelineRasterizationStateInfo.pNext;
      uVar2 = pipelineRasterizationStateInfo._0_8_;
      features.geometryShader = pipelineRasterizationStateInfo.flags;
      features.tessellationShader = pipelineRasterizationStateInfo.depthClampEnable;
      features.sampleRateShading = pipelineRasterizationStateInfo.rasterizerDiscardEnable;
      features.dualSrcBlend = pipelineRasterizationStateInfo.polygonMode;
      features.robustBufferAccess = pipelineRasterizationStateInfo.sType;
      features.fullDrawIndexUint32 = pipelineRasterizationStateInfo._4_4_;
      features._8_8_ = pipelineRasterizationStateInfo.pNext;
      pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      pipelineRasterizationStateInfo._4_4_ = 0;
      pipelineRasterizationStateInfo.pNext = (void *)0x0;
      pipelineRasterizationStateInfo.flags = 0;
      pipelineRasterizationStateInfo.depthClampEnable = 0;
      pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
      pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
      if (local_3b8.m_internal == 0) {
        local_3b8.m_internal = uVar2;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                  (&DStack_3b0,local_3b8);
        DStack_3b0.m_allocator =
             (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
        DStack_3b0.m_device = (VkDevice)features._16_8_;
        local_3b8.m_internal._0_4_ = features.robustBufferAccess;
        local_3b8.m_internal._4_4_ = features.fullDrawIndexUint32;
        DStack_3b0.m_deviceIface = (DeviceInterface *)features._8_8_;
        if (pipelineRasterizationStateInfo._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)17>_> *)
                     &pipelineRasterizationStateInfo.pNext,
                     (VkRenderPass)pipelineRasterizationStateInfo._0_8_);
        }
      }
      makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&resultImage,pDVar14,pVVar15,
                      local_3b8,1,(VkImageView *)&local_468,local_4d8._0_4_,local_4d8._4_4_,1);
      DStack_390.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
      DStack_390.m_device = (VkDevice)resultImage._16_8_;
      DStack_390.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
      TVar13 = resultImage.m_format;
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      if (local_398 == (TextureFormat)0x0) {
        local_398 = TVar13;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  (&DStack_390,(VkFramebuffer)local_398);
        DStack_390.m_allocator =
             (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
        DStack_390.m_device = (VkDevice)features._16_8_;
        local_398.order = features.robustBufferAccess;
        local_398.type = features.fullDrawIndexUint32;
        DStack_390.m_deviceIface = (DeviceInterface *)features._8_8_;
        if (resultImage.m_format != (TextureFormat)0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&resultImage.m_size,
                     (VkFramebuffer)resultImage.m_format);
        }
      }
      makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&resultImage,pDVar14,pVVar15);
      DStack_370.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
      DStack_370.m_device = (VkDevice)resultImage._16_8_;
      DStack_370.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
      TVar13 = resultImage.m_format;
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      if (local_378 == (TextureFormat)0x0) {
        local_378 = TVar13;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                  (&DStack_370,(VkPipelineLayout)local_378);
        DStack_370.m_allocator =
             (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
        DStack_370.m_device = (VkDevice)features._16_8_;
        local_378.order = features.robustBufferAccess;
        local_378.type = features.fullDrawIndexUint32;
        DStack_370.m_deviceIface = (DeviceInterface *)features._8_8_;
        if (resultImage.m_format != (TextureFormat)0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&resultImage.m_size,
                     (VkPipelineLayout)resultImage.m_format);
        }
      }
      TVar10 = local_3d8;
      TVar1 = local_3f8;
      TVar13 = local_418;
      auVar8 = local_4d8;
      fVar25 = local_4a8._0_4_;
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
                (&local_5d0,&scissors);
      vertexInputStateInfo.pVertexBindingDescriptions = &vertexInputBindingDescription;
      vertexInputBindingDescription.binding = 0;
      vertexInputBindingDescription.stride = 0x10;
      vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
      vertexInputStateInfo.pVertexAttributeDescriptions = vertexInputAttributeDescriptions;
      vertexInputAttributeDescriptions[0].location = 0;
      vertexInputAttributeDescriptions[0].binding = 0;
      vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
      vertexInputAttributeDescriptions[0].offset = 0;
      vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
      vertexInputStateInfo.pNext = (void *)0x0;
      vertexInputStateInfo.flags = 0;
      vertexInputStateInfo.vertexBindingDescriptionCount = 1;
      vertexInputStateInfo.vertexAttributeDescriptionCount = 1;
      local_798 = auVar8._0_4_;
      CStack_794 = auVar8._4_4_;
      res_1.height = (float)(int)CStack_794;
      res_1.width = (float)(int)local_798;
      res_1.x = 0.0;
      res_1.y = 0.0;
      res_1.minDepth = 0.0;
      res_1.maxDepth = 1.0;
      std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
                (&viewports,(long)(int)fVar25,&res_1,(allocator_type *)&features);
      rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::reserve
                (&rectScissors,(long)(int)fVar25);
      if (local_5d0.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_5d0.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pVVar22 = local_5d0.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          features.robustBufferAccess = pVVar22->m_data[0];
          features.fullDrawIndexUint32 = pVVar22->m_data[1];
          features._8_8_ = *(VkExtent2D *)(pVVar22->m_data + 2);
          if (rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkRect2D,std::allocator<vk::VkRect2D>>::
            _M_realloc_insert<vk::VkRect2D_const&>
                      ((vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)&rectScissors,
                       (iterator)
                       rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(VkRect2D *)&features);
          }
          else {
            (rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
             super__Vector_impl_data._M_finish)->offset = (VkOffset2D)features._0_8_;
            (rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
             super__Vector_impl_data._M_finish)->extent = (VkExtent2D)features._8_8_;
            rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pVVar22 = pVVar22 + 1;
        } while (pVVar22 !=
                 local_5d0.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      TVar11 = local_3d8;
      TVar9 = local_3f8;
      pipelineRasterizationStateInfo.pNext = (void *)0x0;
      pipelineRasterizationStateInfo.depthBiasClamp = 0.0;
      pipelineRasterizationStateInfo.depthBiasSlopeFactor = 0.0;
      pipelineRasterizationStateInfo.cullMode = 0;
      pipelineRasterizationStateInfo.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
      pipelineRasterizationStateInfo.depthBiasEnable = 0;
      pipelineRasterizationStateInfo.depthBiasConstantFactor = 0.0;
      pipelineRasterizationStateInfo.flags = 0;
      pipelineRasterizationStateInfo.depthClampEnable = 0;
      pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
      pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
      pipelineRasterizationStateInfo.sType =
           VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
      pipelineRasterizationStateInfo._4_4_ = 0;
      pipelineRasterizationStateInfo.lineWidth = 1.0;
      pipelineRasterizationStateInfo._60_4_ = 0;
      referenceImage.m_format.order = sBGR|ARGB;
      referenceImage.m_size.m_data[0] = 0;
      referenceImage.m_size.m_data[1] = 0;
      referenceImage.m_size.m_data[2] = 0;
      referenceImage._20_4_ = 0;
      referenceImage.m_data.m_ptr = (void *)0x100000000;
      referenceImage.m_data.m_cap = 0;
      colorAttachmentRef.attachment = 0x1a;
      features.robustBufferAccess = 0x12;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 0;
      features.tessellationShader = 1;
      features.sampleRateShading = TVar13.order;
      features.dualSrcBlend = TVar13.type;
      features.logicOp = 0xaef845;
      features.multiDrawIndirect = 0;
      features.drawIndirectFirstInstance = 0;
      features.depthClamp = 0;
      features.depthBiasClamp = 0x12;
      features.depthBounds = 0;
      features.wideLines = 0;
      features.largePoints = 0;
      features.alphaToOne = 8;
      local_3f8.order = TVar1.order;
      local_3f8.type = TVar1.type;
      features.multiViewport = local_3f8.order;
      features.samplerAnisotropy = local_3f8.type;
      features._80_8_ = (long)"pre_main" + 4;
      features.textureCompressionBC = 0;
      features.occlusionQueryPrecise = 0;
      features.pipelineStatisticsQuery = 0x12;
      features.fragmentStoresAndAtomics = 0;
      features.shaderTessellationAndGeometryPointSize = 0;
      features.shaderImageGatherExtended = 0;
      features.shaderStorageImageExtendedFormats = 0x10;
      local_3d8.order = TVar10.order;
      local_3d8.type = TVar10.type;
      features.shaderStorageImageMultisample = local_3d8.order;
      features.shaderStorageImageReadWithoutFormat = local_3d8.type;
      features._128_8_ = (long)"pre_main" + 4;
      resultImage.m_format.order = sBGR|sR;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 3;
      resultImage.m_pitch.m_data._4_8_ = &features;
      resultImage.m_data = &vertexInputStateInfo;
      features.shaderSampledImageArrayDynamicIndexing = 0;
      features.shaderStorageBufferArrayDynamicIndexing = 0;
      local_3f8 = TVar9;
      local_3d8 = TVar11;
      ::vk::createGraphicsPipeline
                (&local_5b8,pDVar14,pVVar15,(VkPipelineCache)0x0,
                 (VkGraphicsPipelineCreateInfo *)&resultImage,(VkAllocationCallbacks *)0x0);
      if (rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)rectScissors.
                              super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)rectScissors.
                              super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (viewports.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(viewports.
                        super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)viewports.
                              super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)viewports.
                              super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      DStack_350.m_allocator =
           local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
      DStack_350.m_device =
           local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
      DStack_350.m_deviceIface =
           local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
      HVar6.m_internal =
           local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
      features._16_8_ =
           local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
      features.sampleRateShading =
           (VkBool32)
           local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
      features.dualSrcBlend =
           (VkBool32)
           ((ulong)local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                   m_allocator >> 0x20);
      features.robustBufferAccess =
           (undefined4)
           local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
      features.fullDrawIndexUint32 =
           local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal._4_4_;
      features._8_8_ =
           local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
      local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
      local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      if (local_358.m_internal == 0) {
        local_358.m_internal = HVar6.m_internal;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&DStack_350,local_358);
        DStack_350.m_allocator =
             (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
        DStack_350.m_device = (VkDevice)features._16_8_;
        local_358.m_internal._0_4_ = features.robustBufferAccess;
        local_358.m_internal._4_4_ = features.fullDrawIndexUint32;
        DStack_350.m_deviceIface = (DeviceInterface *)features._8_8_;
        if (local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                    (&local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                     (VkPipeline)
                     local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                     m_internal);
        }
      }
      local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
      local_5b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      if (local_5d0.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5d0.
                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_5d0.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_5d0.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ::vk::createCommandPool
                ((Move<vk::Handle<(vk::HandleType)24>_> *)&resultImage,pDVar14,pVVar15,2,
                 queueFamilyIndex,(VkAllocationCallbacks *)0x0);
      DStack_330.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
      DStack_330.m_device = (VkDevice)resultImage._16_8_;
      DStack_330.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
      TVar13 = resultImage.m_format;
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      if (local_338 == (TextureFormat)0x0) {
        local_338 = TVar13;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  (&DStack_330,(VkCommandPool)local_338);
        DStack_330.m_allocator =
             (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
        DStack_330.m_device = (VkDevice)features._16_8_;
        local_338.order = features.robustBufferAccess;
        local_338.type = features.fullDrawIndexUint32;
        DStack_330.m_deviceIface = (DeviceInterface *)features._8_8_;
        if (resultImage.m_format != (TextureFormat)0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&resultImage.m_size,
                     (VkCommandPool)resultImage.m_format);
        }
      }
      ::vk::allocateCommandBuffer
                ((Move<vk::VkCommandBuffer_s_*> *)&resultImage,pDVar14,pVVar15,
                 (VkCommandPool)local_338,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
      uVar3 = resultImage.m_pitch.m_data._4_8_;
      uVar2 = resultImage.m_size.m_data._0_8_;
      TVar13 = resultImage.m_format;
      iVar19 = resultImage.m_pitch.m_data[0];
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      uVar4 = resultImage.m_pitch.m_data._4_8_;
      if (local_318 == (TextureFormat)0x0) {
        resultImage.m_pitch.m_data[1] = (int)uVar3;
        resultImage.m_pitch.m_data[2] = SUB84(uVar3,4);
        VStack_300 = resultImage.m_pitch.m_data[1];
        VStack_2fc = resultImage.m_pitch.m_data[2];
        VStack_304 = iVar19;
        local_318 = TVar13;
        plStack_310 = (long *)uVar2;
        resultImage.m_pitch.m_data._4_8_ = uVar4;
        local_308 = features.geometryShader;
      }
      else {
        referenceImage.m_format = local_318;
        (**(code **)(*plStack_310 + 0x240))(plStack_310,_local_308,_VStack_300,1);
        local_308 = features.geometryShader;
        VStack_304 = features.tessellationShader;
        VStack_2fc = features.dualSrcBlend;
        VStack_300 = features.sampleRateShading;
        local_318.order = features.robustBufferAccess;
        local_318.type = features.fullDrawIndexUint32;
        plStack_310._0_4_ = features.imageCubeArray;
        plStack_310._4_4_ = features.independentBlend;
        if (resultImage.m_format != (TextureFormat)0x0) {
          features.robustBufferAccess = resultImage.m_format.order;
          features.fullDrawIndexUint32 = resultImage.m_format.type;
          (**(code **)(*(long *)resultImage.m_size.m_data._0_8_ + 0x240))
                    (resultImage.m_size.m_data._0_8_,resultImage._16_8_,
                     resultImage.m_pitch.m_data._4_8_);
        }
      }
      pDVar14 = Context::getDeviceInterface(context);
      pVVar15 = Context::getDevice(context);
      queue = Context::getUniversalQueue(context);
      beginCommandBuffer(pDVar14,(VkCommandBuffer)local_318);
      referenceImage.m_format = local_4b8;
      referenceImage.m_size.m_data[0] = (int)afStack_4b0[0];
      referenceImage.m_size.m_data[1] = (int)afStack_4b0[1];
      resultImage.m_format.order = 0x2b;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = (undefined4)local_3b8.m_internal;
      resultImage.m_pitch.m_data[0] = local_3b8.m_internal._4_4_;
      resultImage.m_pitch.m_data[1] = local_398.order;
      resultImage.m_pitch.m_data[2] = local_398.type;
      resultImage.m_data = (void *)0x0;
      (*pDVar14->_vptr_DeviceInterface[0x74])(pDVar14,local_318,&resultImage,0);
      (*pDVar14->_vptr_DeviceInterface[0x4c])(pDVar14,local_318,0,local_358.m_internal);
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      (*pDVar14->_vptr_DeviceInterface[0x58])(pDVar14,local_318,0,1,&local_448,&features);
      (*pDVar14->_vptr_DeviceInterface[0x59])(pDVar14,local_318,(ulong)local_4a8 & 0xffffffff,1,0,0)
      ;
      (*pDVar14->_vptr_DeviceInterface[0x76])(pDVar14,local_318);
      features.robustBufferAccess = 0x2d;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 0x100;
      features.tessellationShader = 0x800;
      features.sampleRateShading = 2;
      features.dualSrcBlend = 6;
      features.logicOp = 0xffffffff;
      features.multiDrawIndirect = 0xffffffff;
      features.drawIndirectFirstInstance = local_498.order;
      features.depthClamp = local_498.type;
      features.depthBiasClamp = (VkBool32)fStack_4cc;
      features.fillModeNonSolid = local_4c8;
      features.depthBounds = dStack_4c4;
      features.wideLines = dStack_4c0;
      features.largePoints = dStack_4bc;
      uVar27 = SUB84(&features,0);
      (*pDVar14->_vptr_DeviceInterface[0x6d])(pDVar14,local_318,0x400,0x1000,0,0,0,0,0,1,uVar27);
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 1;
      features.tessellationShader = 0;
      features.sampleRateShading = 0;
      features.dualSrcBlend = 1;
      features.logicOp = 0;
      features.multiDrawIndirect = 0;
      features.drawIndirectFirstInstance = 0;
      features.depthClamp = local_4d8._0_4_;
      features.depthBiasClamp = local_4d8._4_4_;
      features.fillModeNonSolid = 1;
      (*pDVar14->_vptr_DeviceInterface[99])(pDVar14,local_318,local_498,6,obj,1,uVar27);
      features.robustBufferAccess = 0x2c;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 0x1000;
      features.tessellationShader = 0x2000;
      features.sampleRateShading = 0xffffffff;
      features.dualSrcBlend = 0xffffffff;
      features.logicOp = (VkBool32)obj;
      features.multiDrawIndirect = SUB84(obj,4);
      features.drawIndirectFirstInstance = 0;
      features.depthClamp = 0;
      features.depthBiasClamp = 0xffffffff;
      features.fillModeNonSolid = 0xffffffff;
      (*pDVar14->_vptr_DeviceInterface[0x6d])(pDVar14,local_318,0x1000,0x4000,0,0,0,1,uVar27,0,0);
      result = (*pDVar14->_vptr_DeviceInterface[0x4a])(pDVar14,local_318);
      ::vk::checkResult(result,"vk.endCommandBuffer(*m_cmdBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
                        ,0x2ac);
      submitCommandsAndWait(pDVar14,pVVar15,queue,(VkCommandBuffer)local_318);
      ScissorRenderer::~ScissorRenderer((ScissorRenderer *)local_4d8);
      ::vk::invalidateMappedMemoryRange
                (vk_00,device,(VkDeviceMemory)((VkDeviceMemory *)((long)auVar7 + 8))->m_internal,0,
                 bufferSize);
      local_4d8 = (undefined1  [8])::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&resultImage,(TextureFormat *)local_4d8,0x80,0x80,1,*(void **)((long)auVar7 + 0x18)
                );
      pipelineRasterizationStateInfo._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
      tcu::TextureLevel::TextureLevel
                (&referenceImage,(TextureFormat *)&pipelineRasterizationStateInfo,0x80,0x80,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_4d8,&referenceImage);
      tcu::clear((PixelBufferAccess *)local_4d8,(Vec4 *)&local_198);
      if (scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar23 = 0;
        uVar20 = 0;
        do {
          tcu::TextureLevel::getAccess((PixelBufferAccess *)&features,&referenceImage);
          tcu::getSubregion((PixelBufferAccess *)local_4d8,(PixelBufferAccess *)&features,
                            *(int *)((long)(scissors.
                                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                    lVar23),
                            *(int *)((long)(scissors.
                                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                    lVar23 + 4),
                            *(int *)((long)(scissors.
                                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                    lVar23 + 8),
                            *(int *)((long)(scissors.
                                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                    lVar23 + 0xc));
          tcu::clear((PixelBufferAccess *)local_4d8,
                     (Vec4 *)((long)(vertexColors.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23));
          uVar20 = uVar20 + 1;
          lVar23 = lVar23 + 0x10;
        } while (uVar20 < (ulong)((long)scissors.
                                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)scissors.
                                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      log = context->m_testCtx->m_log;
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_4d8,&referenceImage);
      features.robustBufferAccess = 0x3ca3d70a;
      features.fullDrawIndexUint32 = 0x3ca3d70a;
      features.imageCubeArray = 0x3ca3d70a;
      features.independentBlend = 0x3ca3d70a;
      bVar24 = tcu::floatThresholdCompare
                         (log,"color","Image compare",(ConstPixelBufferAccess *)local_4d8,
                          &resultImage,(Vec4 *)&features,COMPARE_LOG_RESULT);
      if (bVar24) {
        tcu::TextureLevel::~TextureLevel(&referenceImage);
        local_4d8 = (undefined1  [8])&local_4c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"OK","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_4d8,
                   CONCAT44(fStack_4cc,fStack_4d0) + (long)local_4d8);
        if (local_4d8 != (undefined1  [8])&local_4c8) {
          operator_delete((void *)local_4d8,CONCAT44(dStack_4c4,local_4c8) + 1);
        }
      }
      else {
        local_4d8 = (undefined1  [8])&local_4c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4d8,"Rendered image is not correct","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_4d8,
                   CONCAT44(fStack_4cc,fStack_4d0) + (long)local_4d8);
        if (local_4d8 != (undefined1  [8])&local_4c8) {
          operator_delete((void *)local_4d8,CONCAT44(dStack_4c4,local_4c8) + 1);
        }
        tcu::TextureLevel::~TextureLevel(&referenceImage);
      }
      if ((TextureFormat)auVar7 != (TextureFormat)0x0) {
        (**(code **)(*(long *)auVar7 + 8))();
      }
      if (obj != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&DStack_510,(VkBuffer)obj);
      }
      if (scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scissors.
                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scissors.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scissors.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (vertexColors.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vertexColors.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vertexColors.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vertexColors.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Implementation doesn\'t support minimum required number of viewports",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
               ,0x17f);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus test (Context& context, const int numViewports)
{
	requireFeatureMultiViewport(context.getInstanceInterface(), context.getPhysicalDevice());

	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	Allocator&						allocator			= context.getDefaultAllocator();

	const IVec2						renderSize			(128, 128);
	const VkFormat					colorFormat			= VK_FORMAT_R8G8B8A8_UNORM;
	const Vec4						clearColor			(0.5f, 0.5f, 0.5f, 1.0f);
	const std::vector<Vec4>			vertexColors		= generateColors(numViewports);
	const std::vector<IVec4>		scissors			= generateScissors(numViewports, renderSize);

	const VkDeviceSize				colorBufferSize		= renderSize.x() * renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *colorBufferAlloc, colorBufferSize);

	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Rendering a colorful grid of " << numViewports << " rectangle(s)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Not covered area will be filled with a gray color." << tcu::TestLog::EndMessage;
	}

	// Draw
	{
		const ScissorRenderer renderer (context, renderSize, numViewports, scissors, colorFormat, clearColor, vertexColors);
		renderer.draw(context, *colorBuffer);
	}

	// Log image
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), 0ull, colorBufferSize);

		const tcu::ConstPixelBufferAccess	resultImage		(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferAlloc->getHostPtr());
		const tcu::TextureLevel				referenceImage	= generateReferenceImage(mapVkFormat(colorFormat), renderSize, clearColor, scissors, vertexColors);

		// Images should now match.
		if (!tcu::floatThresholdCompare(context.getTestContext().getLog(), "color", "Image compare", referenceImage.getAccess(), resultImage, Vec4(0.02f), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is not correct");
	}

	return tcu::TestStatus::pass("OK");
}